

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::
on<boost::ext::ut::v1_1_8::detail::eq_<double,boost::ext::ut::v1_1_8::detail::integral_constant<2>>>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *this,
          assertion<boost::ext::ut::v1_1_8::detail::eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<2>_>_>
          assertion)

{
  assertion_pass<boost::ext::ut::v1_1_8::detail::eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<2>_>_>
  aVar1;
  assertion_fail<boost::ext::ut::v1_1_8::detail::eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<2>_>_>
  assertion_00;
  assertion<boost::ext::ut::v1_1_8::detail::eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<2>_>_>
  aVar2;
  bool bVar3;
  undefined6 uStack_4e;
  undefined4 uStack_3c;
  undefined6 uStack_2e;
  undefined4 uStack_1c;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this_local;
  
  if (((byte)this[0x348] & 1) == 0) {
    bVar3 = detail::eq_::operator_cast_to_bool((eq_ *)&assertion);
    aVar2 = assertion;
    assertion = aVar2;
    if (bVar3) {
      aVar1.expr._10_6_ = uStack_2e;
      aVar1.expr._8_1_ = assertion.expr._8_1_;
      aVar1.expr.value_ = assertion.expr.value_;
      aVar1.location._12_4_ = uStack_1c;
      aVar1.location.line_ = assertion.location.line_;
      aVar1.expr.lhs_ = assertion.expr.lhs_;
      aVar1.location.file_ = assertion.location.file_;
      reporter<boost::ext::ut::v1_1_8::printer>::
      on<boost::ext::ut::v1_1_8::detail::eq_<double,boost::ext::ut::v1_1_8::detail::integral_constant<2>>>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)this,aVar1);
      this_local._7_1_ = true;
    }
    else {
      *(long *)(this + 0x210) = *(long *)(this + 0x210) + 1;
      assertion_00.expr._10_6_ = uStack_4e;
      assertion_00.expr._8_1_ = assertion.expr._8_1_;
      assertion_00.expr.value_ = assertion.expr.value_;
      assertion_00.location._12_4_ = uStack_3c;
      assertion_00.location.line_ = assertion.location.line_;
      assertion_00.expr.lhs_ = assertion.expr.lhs_;
      assertion_00.location.file_ = assertion.location.file_;
      reporter<boost::ext::ut::v1_1_8::printer>::
      on<boost::ext::ut::v1_1_8::detail::eq_<double,boost::ext::ut::v1_1_8::detail::integral_constant<2>>>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)this,assertion_00);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }